

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O3

basic_executor_type<std::allocator<void>,_0UL> * __thiscall
asio::execution::detail::any_executor_base::
target<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>(any_executor_base *this)

{
  char *__s1;
  int iVar1;
  type_info *ptVar2;
  basic_executor_type<std::allocator<void>,_0UL> *pbVar3;
  
  if (this->target_ == (void *)0x0) {
    return (basic_executor_type<std::allocator<void>,_0UL> *)0x0;
  }
  ptVar2 = (*this->target_fns_->target_type)();
  __s1 = *(char **)(ptVar2 + 8);
  if (__s1 == "N4asio10io_context19basic_executor_typeISaIvELm0EEE") {
LAB_002ac4c1:
    pbVar3 = (basic_executor_type<std::allocator<void>,_0UL> *)this->target_;
  }
  else {
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,"N4asio10io_context19basic_executor_typeISaIvELm0EEE");
      if (iVar1 == 0) goto LAB_002ac4c1;
    }
    pbVar3 = (basic_executor_type<std::allocator<void>,_0UL> *)0x0;
  }
  return pbVar3;
}

Assistant:

const Executor* target() const
  {
    return target_ && (is_same<Executor, void>::value
        || target_fns_->target_type() == target_type_ex<Executor>())
      ? static_cast<const Executor*>(target_) : 0;
  }